

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall
QHttp2Stream::streamError(QHttp2Stream *this,Http2Error errorCode,QLatin1StringView message)

{
  uint uVar1;
  QHttp2Connection *pQVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qHttp2ConnectionLog();
  if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
      0) {
    local_58.d._0_4_ = 2;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_58.size._4_4_ = 0;
    local_40 = qHttp2ConnectionLog::category.name;
    pQVar2 = getConnection(this);
    uVar1 = *(uint *)(this + 0x10);
    QString::QString((QString *)&local_70,message);
    uVar3 = QString::utf16();
    QMessageLogger::debug
              ((char *)&local_58,"[%p] stream %u finished with error: %ls (error code: %u)",pQVar2,
               (ulong)uVar1,uVar3,errorCode);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  sendRST_STREAM(this,errorCode);
  QString::QString((QString *)&local_58,message);
  errorOccurred(this,errorCode,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::streamError(Http2::Http2Error errorCode,
                               QLatin1StringView message)
{
    qCDebug(qHttp2ConnectionLog, "[%p] stream %u finished with error: %ls (error code: %u)",
            getConnection(), m_streamID, qUtf16Printable(message), errorCode);

    sendRST_STREAM(errorCode);
    emit errorOccurred(errorCode, message);
}